

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_134::
     genericCheckTestMessage<capnproto_test::capnp::test::TestDefaults::Builder>(Builder reader)

{
  Builder reader_00;
  Builder reader_01;
  Builder reader_02;
  Builder reader_03;
  Builder reader_04;
  Builder reader_05;
  Builder reader_06;
  Builder reader_07;
  Builder reader_08;
  Builder reader_09;
  Builder reader_10;
  Builder reader_11;
  Builder reader_12;
  Builder reader_13;
  Builder reader_14;
  Builder reader_15;
  Builder reader_16;
  Builder reader_17;
  Builder reader_18;
  Builder reader_19;
  Builder reader_20;
  Builder reader_21;
  Builder reader_22;
  Builder reader_23;
  Builder reader_24;
  Builder reader_25;
  Builder reader_26;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected;
  initializer_list<capnp::Data::Reader> expected_00;
  initializer_list<capnp::Text::Reader> expected_01;
  initializer_list<unsigned_long> expected_02;
  initializer_list<unsigned_int> expected_03;
  initializer_list<unsigned_short> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<long> expected_06;
  initializer_list<int> expected_07;
  initializer_list<short> expected_08;
  initializer_list<signed_char> expected_09;
  initializer_list<bool> expected_10;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<capnp::Text::Reader> expected_13;
  initializer_list<double> expected_14;
  initializer_list<float> expected_15;
  initializer_list<unsigned_long> expected_16;
  initializer_list<unsigned_int> expected_17;
  initializer_list<unsigned_short> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<long> expected_20;
  initializer_list<int> expected_21;
  initializer_list<short> expected_22;
  initializer_list<signed_char> expected_23;
  initializer_list<bool> expected_24;
  initializer_list<capnp::Void> expected_25;
  bool bVar1;
  float fVar2;
  double dVar3;
  TestEnum_9c8e9318b29d9cd3 local_1974 [2];
  iterator local_1970;
  undefined8 local_1968;
  Builder local_1960;
  Builder local_1938;
  Builder local_1910;
  bool local_18f1;
  undefined1 local_18f0 [7];
  bool _kj_shouldLog_46;
  Builder local_18c8;
  char (*local_18b0) [13];
  undefined1 local_18a8 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Builder> _kjCondition_50;
  Builder local_1848;
  bool local_1829;
  undefined1 local_1828 [7];
  bool _kj_shouldLog_45;
  Builder local_1800;
  char (*local_17e8) [13];
  undefined1 local_17e0 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Builder> _kjCondition_49;
  Builder local_1780;
  bool local_1761;
  undefined1 local_1760 [7];
  bool _kj_shouldLog_44;
  Builder local_1738;
  char (*local_1720) [13];
  undefined1 local_1718 [8];
  DebugComparison<const_char_(&)[13],_capnp::Text::Builder> _kjCondition_48;
  Fault local_16d8;
  Fault f_3;
  uint local_16c8;
  DebugExpression<unsigned_int> local_16c4;
  undefined1 local_16c0 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_47;
  Builder listReader_3;
  Builder local_1638;
  Reader local_1610;
  Reader RStack_1600;
  Reader RStack_15f0;
  iterator local_15e0;
  undefined8 local_15d8;
  Builder local_15d0;
  bool local_15a3;
  bool local_15a2;
  DebugExpression<bool> local_15a1;
  bool _kj_shouldLog_43;
  double dStack_15a0;
  DebugExpression<bool> _kjCondition_46;
  float local_1598;
  bool local_1591;
  double dStack_1590;
  bool _kj_shouldLog_42;
  float local_1588;
  DebugExpression<float> local_1584;
  undefined1 local_1580 [8];
  DebugComparison<float,_double> _kjCondition_45;
  float local_1550;
  bool local_1549;
  double dStack_1548;
  bool _kj_shouldLog_41;
  float local_1540;
  DebugExpression<float> local_153c;
  undefined1 local_1538 [8];
  DebugComparison<float,_double> _kjCondition_44;
  double local_1508;
  bool local_14f9;
  double dStack_14f8;
  bool _kj_shouldLog_40;
  double local_14f0;
  DebugExpression<double> local_14e8;
  undefined1 local_14e0 [8];
  DebugComparison<double,_double> _kjCondition_43;
  Fault local_14b0;
  Fault f_2;
  uint local_14a0;
  DebugExpression<unsigned_int> local_149c;
  undefined1 local_1498 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_42;
  Builder listReader_2;
  float local_1448;
  bool _kj_shouldLog_39;
  float fStack_1444;
  DebugExpression<bool> _kjCondition_41;
  bool local_143d;
  float local_143c;
  float fStack_1438;
  bool _kj_shouldLog_38;
  DebugExpression<float> local_1434;
  undefined1 local_1430 [8];
  DebugComparison<float,_float> _kjCondition_40;
  bool local_1405;
  float local_1404;
  float fStack_1400;
  bool _kj_shouldLog_37;
  DebugExpression<float> local_13fc;
  undefined1 local_13f8 [8];
  DebugComparison<float,_float> _kjCondition_39;
  bool local_13cd;
  float local_13cc;
  float fStack_13c8;
  bool _kj_shouldLog_36;
  DebugExpression<float> local_13c4;
  undefined1 local_13c0 [8];
  DebugComparison<float,_float> _kjCondition_38;
  Fault local_1398;
  Fault f_1;
  uint local_1388;
  DebugExpression<unsigned_int> local_1384;
  undefined1 local_1380 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_37;
  Builder listReader_1;
  Builder local_1320;
  uint local_12f4;
  iterator local_12f0;
  undefined8 local_12e8;
  Builder local_12e0;
  unsigned_short local_12b4 [2];
  iterator local_12b0;
  undefined8 local_12a8;
  Builder local_12a0;
  uchar local_1272 [2];
  iterator local_1270;
  undefined8 local_1268;
  Builder local_1260;
  long local_1238 [2];
  iterator local_1228;
  undefined8 local_1220;
  Builder local_1218;
  int local_11f0 [2];
  iterator local_11e8;
  undefined8 local_11e0;
  Builder local_11d8;
  short local_11ac [2];
  iterator local_11a8;
  undefined8 local_11a0;
  Builder local_1198;
  char local_116a [2];
  iterator local_1168;
  undefined8 local_1160;
  Builder local_1158;
  bool local_112c [4];
  iterator local_1128;
  undefined8 local_1120;
  Builder local_1118;
  Builder local_10f0;
  uint local_10c4;
  uint local_10c0;
  bool local_10b9;
  undefined1 local_10b8 [7];
  bool _kj_shouldLog_35;
  uint local_108c;
  uint local_1088;
  DebugExpression<unsigned_int> local_1084;
  undefined1 local_1080 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_36;
  bool local_1057;
  TestEnum local_1056;
  TestEnum_9c8e9318b29d9cd3 local_1054;
  DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_1052;
  undefined1 local_1050;
  bool _kj_shouldLog_34;
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  _kjCondition_35;
  Builder local_1018;
  Builder local_ff0;
  Builder local_fc8;
  bool local_fa9;
  undefined1 local_fa8 [7];
  bool _kj_shouldLog_33;
  Builder local_f80;
  char (*local_f68) [15];
  undefined1 local_f60 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Builder> _kjCondition_34;
  Builder local_f00;
  bool local_ee1;
  undefined1 local_ee0 [7];
  bool _kj_shouldLog_32;
  Builder local_eb8;
  char (*local_ea0) [15];
  undefined1 local_e98 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Builder> _kjCondition_33;
  Builder local_e38;
  bool local_e19;
  undefined1 local_e18 [7];
  bool _kj_shouldLog_31;
  Builder local_df0;
  char (*local_dd8) [15];
  undefined1 local_dd0 [8];
  DebugComparison<const_char_(&)[15],_capnp::Text::Builder> _kjCondition_32;
  uint local_d88;
  uint local_d84;
  Fault local_d80;
  Fault f;
  uint local_d70;
  DebugExpression<unsigned_int> local_d6c;
  undefined1 local_d68 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_31;
  Builder listReader;
  Builder local_ce0;
  Reader local_cb8;
  Reader RStack_ca8;
  Reader RStack_c98;
  iterator local_c88;
  undefined8 local_c80;
  Builder local_c78;
  double local_c50 [6];
  iterator local_c20;
  undefined8 local_c18;
  Builder local_c10;
  float local_be8 [6];
  iterator local_bd0;
  undefined8 local_bc8;
  Builder local_bc0;
  unsigned_long local_b98 [4];
  iterator local_b78;
  undefined8 local_b70;
  Builder local_b68;
  uint local_b40 [4];
  iterator local_b30;
  undefined8 local_b28;
  Builder local_b20;
  unsigned_short local_af8 [4];
  iterator local_af0;
  undefined8 local_ae8;
  Builder local_ae0;
  uchar local_ab4 [4];
  iterator local_ab0;
  undefined8 local_aa8;
  Builder local_aa0;
  long local_a78 [4];
  iterator local_a58;
  undefined8 local_a50;
  Builder local_a48;
  int local_a20 [4];
  iterator local_a10;
  undefined8 local_a08;
  Builder local_a00;
  short local_9d8 [4];
  iterator local_9d0;
  undefined8 local_9c8;
  Builder local_9c0;
  char local_994 [4];
  iterator local_990;
  undefined8 local_988;
  Builder local_980;
  bool local_955 [5];
  iterator local_950;
  undefined8 local_948;
  Builder local_940;
  Void local_913 [3];
  iterator local_910;
  undefined8 local_908;
  Builder local_900;
  TestEnum local_8d4;
  TestEnum_9c8e9318b29d9cd3 local_8d2;
  bool local_8cf;
  TestEnum local_8ce;
  TestEnum_9c8e9318b29d9cd3 local_8cc;
  DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_8ca;
  undefined1 local_8c8;
  bool _kj_shouldLog_30;
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  _kjCondition_30;
  Builder local_880;
  bool local_861;
  undefined1 local_860 [7];
  bool _kj_shouldLog_29;
  Builder local_838;
  char (*local_820) [14];
  undefined1 local_818 [8];
  DebugComparison<const_char_(&)[14],_capnp::Text::Builder> _kjCondition_29;
  bool local_7c1;
  undefined1 local_7c0 [7];
  bool _kj_shouldLog_28;
  char (*local_7a8) [7];
  undefined1 local_7a0 [8];
  DebugComparison<const_char_(&)[7],_capnp::Text::Builder> _kjCondition_28;
  Builder subSubReader;
  ArrayPtr<const_unsigned_char> local_730;
  bool local_719;
  undefined1 auStack_718 [7];
  bool _kj_shouldLog_27;
  ArrayPtr<const_unsigned_char> local_708;
  ArrayPtr<const_unsigned_char> local_6f8;
  undefined1 local_6e8 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> _kjCondition_27;
  bool local_691;
  undefined1 local_690 [7];
  bool _kj_shouldLog_26;
  char (*local_678) [4];
  undefined1 local_670 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_26;
  double local_630;
  bool local_627;
  bool local_626;
  DebugExpression<bool> local_625;
  float local_624;
  bool _kj_shouldLog_25;
  float fStack_620;
  DebugExpression<bool> _kjCondition_25;
  bool local_61b;
  bool local_61a;
  DebugExpression<bool> local_619;
  bool _kj_shouldLog_24;
  uint64_t uStack_618;
  DebugExpression<bool> _kjCondition_24;
  unsigned_long_long local_610;
  bool local_601;
  uint64_t uStack_600;
  bool _kj_shouldLog_23;
  unsigned_long_long local_5f8;
  DebugExpression<unsigned_long_long> local_5f0;
  undefined1 local_5e8 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_23;
  bool local_5b5;
  uint32_t local_5b4;
  uint uStack_5b0;
  bool _kj_shouldLog_22;
  DebugExpression<unsigned_int> local_5ac;
  undefined1 local_5a8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_22;
  uint local_580;
  bool local_57b;
  uint16_t local_57a;
  uint local_578;
  bool _kj_shouldLog_21;
  DebugExpression<unsigned_int> DStack_574;
  undefined1 local_570 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_21;
  uint local_548;
  bool local_542;
  uint8_t local_541;
  uint local_540;
  bool _kj_shouldLog_20;
  DebugExpression<unsigned_int> DStack_53c;
  undefined1 local_538 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_20;
  longlong local_510;
  bool local_501;
  int64_t iStack_500;
  bool _kj_shouldLog_19;
  longlong local_4f8;
  DebugExpression<long_long> local_4f0;
  undefined1 local_4e8 [8];
  DebugComparison<long_long,_long> _kjCondition_19;
  bool local_4b5;
  int32_t local_4b4;
  int iStack_4b0;
  bool _kj_shouldLog_18;
  DebugExpression<int> local_4ac;
  undefined1 local_4a8 [8];
  DebugComparison<int,_int> _kjCondition_18;
  int local_480;
  bool local_47b;
  int16_t local_47a;
  int local_478;
  bool _kj_shouldLog_17;
  DebugExpression<int> DStack_474;
  undefined1 local_470 [8];
  DebugComparison<int,_short> _kjCondition_17;
  int local_448;
  bool local_442;
  int8_t local_441;
  int local_440;
  bool _kj_shouldLog_16;
  DebugExpression<int> DStack_43c;
  undefined1 local_438 [8];
  DebugComparison<int,_signed_char> _kjCondition_16;
  undefined1 local_410 [4];
  bool _kj_shouldLog_15;
  DebugComparison<bool,_bool> _kjCondition_15;
  bool _kj_shouldLog_14;
  DebugExpression<const_capnp::Void_&> DStack_3e8;
  undefined1 local_3e0 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition_14;
  Builder subReader;
  ArrayPtr<const_unsigned_char> local_380;
  bool local_369;
  undefined1 auStack_368 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_unsigned_char> local_358;
  ArrayPtr<const_unsigned_char> local_348;
  undefined1 local_338 [8];
  DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> _kjCondition_13;
  bool local_2e1;
  undefined1 local_2e0 [7];
  bool _kj_shouldLog_12;
  char (*local_2c8) [4];
  undefined1 local_2c0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Builder> _kjCondition_12;
  double local_280;
  bool local_277;
  bool local_276;
  DebugExpression<bool> local_275;
  float local_274;
  bool _kj_shouldLog_11;
  float fStack_270;
  DebugExpression<bool> _kjCondition_11;
  bool local_26b;
  bool local_26a;
  DebugExpression<bool> local_269;
  bool _kj_shouldLog_10;
  uint64_t uStack_268;
  DebugExpression<bool> _kjCondition_10;
  unsigned_long_long local_260;
  bool local_251;
  uint64_t uStack_250;
  bool _kj_shouldLog_9;
  unsigned_long_long local_248;
  DebugExpression<unsigned_long_long> local_240;
  undefined1 local_238 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_9;
  bool local_205;
  uint32_t local_204;
  uint uStack_200;
  bool _kj_shouldLog_8;
  DebugExpression<unsigned_int> local_1fc;
  undefined1 local_1f8 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_8;
  uint local_1d0;
  bool local_1cb;
  uint16_t local_1ca;
  uint local_1c8;
  bool _kj_shouldLog_7;
  DebugExpression<unsigned_int> DStack_1c4;
  undefined1 local_1c0 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_7;
  uint local_198;
  bool local_192;
  uint8_t local_191;
  uint local_190;
  bool _kj_shouldLog_6;
  DebugExpression<unsigned_int> DStack_18c;
  undefined1 local_188 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_6;
  longlong local_160;
  bool local_151;
  int64_t iStack_150;
  bool _kj_shouldLog_5;
  longlong local_148;
  DebugExpression<long_long> local_140;
  undefined1 local_138 [8];
  DebugComparison<long_long,_long> _kjCondition_5;
  bool local_105;
  int32_t local_104;
  int iStack_100;
  bool _kj_shouldLog_4;
  DebugExpression<int> local_fc;
  undefined1 local_f8 [8];
  DebugComparison<int,_int> _kjCondition_4;
  int local_d0;
  bool local_cb;
  int16_t local_ca;
  int local_c8;
  bool _kj_shouldLog_3;
  DebugExpression<int> DStack_c4;
  undefined1 local_c0 [8];
  DebugComparison<int,_short> _kjCondition_3;
  int local_98;
  bool local_92;
  int8_t local_91;
  int local_90;
  bool _kj_shouldLog_2;
  DebugExpression<int> DStack_8c;
  undefined1 local_88 [8];
  DebugComparison<int,_signed_char> _kjCondition_2;
  undefined1 local_60 [4];
  bool _kj_shouldLog_1;
  DebugComparison<bool,_bool> _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<const_capnp::Void_&> DStack_38;
  undefined1 local_30 [8];
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  
  DStack_38 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  capnproto_test::capnp::test::TestDefaults::Builder::getVoidField((Builder *)&stack0x00000008);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,
             (DebugExpression<capnp::Void_const&> *)&stack0xffffffffffffffc8,
             (Void *)&_kjCondition_1.field_0x1f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    _kjCondition_1._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._29_1_ != '\0') {
      capnproto_test::capnp::test::TestDefaults::Builder::getVoidField((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdb,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.getVoidField())\", _kjCondition, VOID, reader.getVoidField()"
                 ,(char (*) [51])"failed: expected (VOID) == (reader.getVoidField())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_30,(Void *)&VOID,
                 (Void *)&_kjCondition_1.field_0x1c);
      _kjCondition_1._29_1_ = 0;
    }
  }
  _kjCondition_2._30_1_ = 1;
  _kjCondition_2._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_2.field_0x1e);
  _kjCondition_2._29_1_ =
       capnproto_test::capnp::test::TestDefaults::Builder::getBoolField((Builder *)&stack0x00000008)
  ;
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_60,
             (DebugExpression<bool> *)&_kjCondition_2.field_0x1f,(bool *)&_kjCondition_2.field_0x1d)
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    _kjCondition_2._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._28_1_ != '\0') {
      _kjCondition_2._27_1_ = 1;
      _kjCondition_2._26_1_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getBoolField
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdc,ERROR,
                 "\"failed: expected \" \"(true) == (reader.getBoolField())\", _kjCondition, true, reader.getBoolField()"
                 ,(char (*) [51])"failed: expected (true) == (reader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_60,(bool *)&_kjCondition_2.field_0x1b,
                 (bool *)&_kjCondition_2.field_0x1a);
      _kjCondition_2._28_1_ = 0;
    }
  }
  local_90 = -0x7b;
  DStack_8c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_90);
  local_91 = capnproto_test::capnp::test::TestDefaults::Builder::getInt8Field
                       ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_88,&stack0xffffffffffffff74,&local_91);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_88);
  if (!bVar1) {
    local_92 = kj::_::Debug::shouldLog(ERROR);
    while (local_92 != false) {
      local_98 = -0x7b;
      _kjCondition_3._31_1_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getInt8Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdd,ERROR,
                 "\"failed: expected \" \"(-123) == (reader.getInt8Field())\", _kjCondition, -123, reader.getInt8Field()"
                 ,(char (*) [51])"failed: expected (-123) == (reader.getInt8Field())",
                 (DebugComparison<int,_signed_char> *)local_88,&local_98,&_kjCondition_3.field_0x1f)
      ;
      local_92 = false;
    }
  }
  local_c8 = -0x3039;
  DStack_c4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
  local_ca = capnproto_test::capnp::test::TestDefaults::Builder::getInt16Field
                       ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_c0,&stack0xffffffffffffff3c,&local_ca);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
  if (!bVar1) {
    local_cb = kj::_::Debug::shouldLog(ERROR);
    while (local_cb != false) {
      local_d0 = -0x3039;
      _kjCondition_4._30_2_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getInt16Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xde,ERROR,
                 "\"failed: expected \" \"(-12345) == (reader.getInt16Field())\", _kjCondition, -12345, reader.getInt16Field()"
                 ,(char (*) [54])"failed: expected (-12345) == (reader.getInt16Field())",
                 (DebugComparison<int,_short> *)local_c0,&local_d0,
                 (short *)&_kjCondition_4.field_0x1e);
      local_cb = false;
    }
  }
  iStack_100 = -0xbc614e;
  local_fc = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffff00);
  local_104 = capnproto_test::capnp::test::TestDefaults::Builder::getInt32Field
                        ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_f8,&local_fc,&local_104);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
  if (!bVar1) {
    local_105 = kj::_::Debug::shouldLog(ERROR);
    while (local_105 != false) {
      _kjCondition_5._36_4_ = 0xff439eb2;
      _kjCondition_5._32_4_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getInt32Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xdf,ERROR,
                 "\"failed: expected \" \"(-12345678) == (reader.getInt32Field())\", _kjCondition, -12345678, reader.getInt32Field()"
                 ,(char (*) [57])"failed: expected (-12345678) == (reader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_f8,(int *)&_kjCondition_5.field_0x24,
                 (int *)&_kjCondition_5.result);
      local_105 = false;
    }
  }
  local_148 = -0x7048860ddf79;
  local_140 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_148);
  iStack_150 = capnproto_test::capnp::test::TestDefaults::Builder::getInt64Field
                         ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long> *)local_138,&local_140,&stack0xfffffffffffffeb0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    local_151 = kj::_::Debug::shouldLog(ERROR);
    while (local_151 != false) {
      local_160 = -0x7048860ddf79;
      _kjCondition_6._24_8_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getInt64Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[66],kj::_::DebugComparison<long_long,long>&,long_long,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe0,ERROR,
                 "\"failed: expected \" \"(-123456789012345ll) == (reader.getInt64Field())\", _kjCondition, -123456789012345ll, reader.getInt64Field()"
                 ,(char (*) [66])"failed: expected (-123456789012345ll) == (reader.getInt64Field())"
                 ,(DebugComparison<long_long,_long> *)local_138,&local_160,
                 (long *)&_kjCondition_6.result);
      local_151 = false;
    }
  }
  local_190 = 0xea;
  DStack_18c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_190);
  local_191 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt8Field
                        ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_188,&stack0xfffffffffffffe74,
             &local_191);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
  if (!bVar1) {
    local_192 = kj::_::Debug::shouldLog(ERROR);
    while (local_192 != false) {
      local_198 = 0xea;
      _kjCondition_7._31_1_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getUInt8Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe1,ERROR,
                 "\"failed: expected \" \"(234u) == (reader.getUInt8Field())\", _kjCondition, 234u, reader.getUInt8Field()"
                 ,(char (*) [52])"failed: expected (234u) == (reader.getUInt8Field())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_188,&local_198,
                 &_kjCondition_7.field_0x1f);
      local_192 = false;
    }
  }
  local_1c8 = 0xb26e;
  DStack_1c4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c8);
  local_1ca = capnproto_test::capnp::test::TestDefaults::Builder::getUInt16Field
                        ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_1c0,&stack0xfffffffffffffe3c,
             &local_1ca);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c0);
  if (!bVar1) {
    local_1cb = kj::_::Debug::shouldLog(ERROR);
    while (local_1cb != false) {
      local_1d0 = 0xb26e;
      _kjCondition_8._30_2_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getUInt16Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe2,ERROR,
                 "\"failed: expected \" \"(45678u) == (reader.getUInt16Field())\", _kjCondition, 45678u, reader.getUInt16Field()"
                 ,(char (*) [55])"failed: expected (45678u) == (reader.getUInt16Field())",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_1c0,&local_1d0,
                 (unsigned_short *)&_kjCondition_8.field_0x1e);
      local_1cb = false;
    }
  }
  uStack_200 = 0xce0a6a14;
  local_1fc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffe00);
  local_204 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt32Field
                        ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1f8,&local_1fc,&local_204);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f8);
  if (!bVar1) {
    local_205 = kj::_::Debug::shouldLog(ERROR);
    while (local_205 != false) {
      _kjCondition_9._36_4_ = 0xce0a6a14;
      _kjCondition_9._32_4_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getUInt32Field
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe3,ERROR,
                 "\"failed: expected \" \"(3456789012u) == (reader.getUInt32Field())\", _kjCondition, 3456789012u, reader.getUInt32Field()"
                 ,(char (*) [60])"failed: expected (3456789012u) == (reader.getUInt32Field())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1f8,
                 (uint *)&_kjCondition_9.field_0x24,(uint *)&_kjCondition_9.result);
      local_205 = false;
    }
  }
  local_248 = 0xab54a98ceb1f0ad2;
  local_240 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_248);
  uStack_250 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt64Field
                         ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_238,&local_240,
             &stack0xfffffffffffffdb0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_238);
  if (!bVar1) {
    local_251 = kj::_::Debug::shouldLog(ERROR);
    while (local_251 != false) {
      local_260 = 0xab54a98ceb1f0ad2;
      uStack_268 = capnproto_test::capnp::test::TestDefaults::Builder::getUInt64Field
                             ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[72],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe4,ERROR,
                 "\"failed: expected \" \"(12345678901234567890ull) == (reader.getUInt64Field())\", _kjCondition, 12345678901234567890ull, reader.getUInt64Field()"
                 ,(char (*) [72])
                  "failed: expected (12345678901234567890ull) == (reader.getUInt64Field())",
                 (DebugComparison<unsigned_long_long,_unsigned_long> *)local_238,&local_260,
                 &stack0xfffffffffffffd98);
      local_251 = false;
    }
  }
  fVar2 = capnproto_test::capnp::test::TestDefaults::Builder::getFloat32Field
                    ((Builder *)&stack0x00000008);
  local_26a = kj::_::floatAlmostEqual(fVar2,1234.5);
  local_269 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_26a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_269);
  if (!bVar1) {
    local_26b = kj::_::Debug::shouldLog(ERROR);
    while (local_26b != false) {
      fStack_270 = capnproto_test::capnp::test::TestDefaults::Builder::getFloat32Field
                             ((Builder *)&stack0x00000008);
      local_274 = 1234.5;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)\", _kjCondition, reader.getFloat32Field(), 1234.5f"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)",
                 &local_269,&stack0xfffffffffffffd90,&local_274);
      local_26b = false;
    }
  }
  dVar3 = capnproto_test::capnp::test::TestDefaults::Builder::getFloat64Field
                    ((Builder *)&stack0x00000008);
  local_276 = kj::_::doubleAlmostEqual(dVar3,-1.23e+47);
  local_275 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_276);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_275);
  if (!bVar1) {
    local_277 = kj::_::Debug::shouldLog(ERROR);
    while (local_277 != false) {
      local_280 = capnproto_test::capnp::test::TestDefaults::Builder::getFloat64Field
                            ((Builder *)&stack0x00000008);
      _kjCondition_12.result = false;
      _kjCondition_12._49_7_ = 0xc9b58b82c0e0bb;
      kj::_::Debug::log<char_const(&)[79],kj::_::DebugExpression<bool>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)\", _kjCondition, reader.getFloat64Field(), -123e45"
                 ,(char (*) [79])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)",
                 &local_275,&local_280,(double *)&_kjCondition_12.result);
      local_277 = false;
    }
  }
  local_2c8 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestDefaults::Builder::getTextField
            ((Builder *)local_2e0,(Builder *)&stack0x00000008);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2c0,
             (DebugExpression<char_const(&)[4]> *)&local_2c8,(Builder *)local_2e0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2c0);
  if (!bVar1) {
    local_2e1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e1 != false) {
      capnproto_test::capnp::test::TestDefaults::Builder::getTextField
                ((Builder *)&_kjCondition_13.result,(Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe7,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.getTextField())\", _kjCondition, \"foo\", reader.getTextField()"
                 ,(char (*) [52])"failed: expected (\"foo\") == (reader.getTextField())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_2c0,
                 (char (*) [4])"foo",(Builder *)&_kjCondition_13.result);
      local_2e1 = false;
    }
  }
  local_358 = (ArrayPtr<const_unsigned_char>)_::data("bar");
  local_348 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_358);
  _auStack_368 = (ArrayPtr<unsigned_char>)
                 capnproto_test::capnp::test::TestDefaults::Builder::getDataField
                           ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_338,
             (DebugExpression<capnp::Data::Reader> *)&local_348,(Builder *)auStack_368);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_338);
  if (!bVar1) {
    local_369 = kj::_::Debug::shouldLog(ERROR);
    while (local_369 != false) {
      local_380 = (ArrayPtr<const_unsigned_char>)_::data("bar");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<unsigned_char>)
           capnproto_test::capnp::test::TestDefaults::Builder::getDataField
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe8,ERROR,
                 "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.getDataField())\", _kjCondition, data(\"bar\"), reader.getDataField()"
                 ,(char (*) [58])"failed: expected (data(\"bar\")) == (reader.getDataField())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_338,
                 (Reader *)&local_380,(Builder *)&subReader._builder.dataSize);
      local_369 = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getStructField
            ((Builder *)&_kjCondition_14.result,(Builder *)&stack0x00000008);
  DStack_3e8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Void *)&VOID);
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField
            ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<capnp::Void_const&>::operator==
            ((DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_3e0,
             (DebugExpression<capnp::Void_const&> *)&stack0xfffffffffffffc18,
             (Void *)&_kjCondition_15.field_0x1f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3e0);
  if (!bVar1) {
    _kjCondition_15._29_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_15._29_1_ != '\0') {
      capnproto_test::capnp::test::TestAllTypes::Builder::getVoidField
                ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.getVoidField())\", _kjCondition, VOID, subReader.getVoidField()"
                 ,(char (*) [54])"failed: expected (VOID) == (subReader.getVoidField())",
                 (DebugComparison<const_capnp::Void_&,_capnp::Void> *)local_3e0,(Void *)&VOID,
                 (Void *)&_kjCondition_15.field_0x1c);
      _kjCondition_15._29_1_ = 0;
    }
  }
  _kjCondition_16._30_1_ = 1;
  _kjCondition_16._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_16.field_0x1e);
  _kjCondition_16._29_1_ =
       capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                 ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_410,
             (DebugExpression<bool> *)&_kjCondition_16.field_0x1f,
             (bool *)&_kjCondition_16.field_0x1d);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_410);
  if (!bVar1) {
    _kjCondition_16._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_16._28_1_ != '\0') {
      _kjCondition_16._27_1_ = 1;
      _kjCondition_16._26_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getBoolField
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<bool,bool>&,bool,bool>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(true) == (subReader.getBoolField())\", _kjCondition, true, subReader.getBoolField()"
                 ,(char (*) [54])"failed: expected (true) == (subReader.getBoolField())",
                 (DebugComparison<bool,_bool> *)local_410,(bool *)&_kjCondition_16.field_0x1b,
                 (bool *)&_kjCondition_16.field_0x1a);
      _kjCondition_16._28_1_ = 0;
    }
  }
  local_440 = -0xc;
  DStack_43c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_440);
  local_441 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_438,&stack0xfffffffffffffbc4,&local_441);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_438);
  if (!bVar1) {
    local_442 = kj::_::Debug::shouldLog(ERROR);
    while (local_442 != false) {
      local_448 = -0xc;
      _kjCondition_17._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt8Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[53],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(-12) == (subReader.getInt8Field())\", _kjCondition, -12, subReader.getInt8Field()"
                 ,(char (*) [53])"failed: expected (-12) == (subReader.getInt8Field())",
                 (DebugComparison<int,_signed_char> *)local_438,&local_448,
                 &_kjCondition_17.field_0x1f);
      local_442 = false;
    }
  }
  local_478 = 0xd80;
  DStack_474 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_478);
  local_47a = capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_470,&stack0xfffffffffffffb8c,&local_47a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_470);
  if (!bVar1) {
    local_47b = kj::_::Debug::shouldLog(ERROR);
    while (local_47b != false) {
      local_480 = 0xd80;
      _kjCondition_18._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt16Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"(3456) == (subReader.getInt16Field())\", _kjCondition, 3456, subReader.getInt16Field()"
                 ,(char (*) [55])"failed: expected (3456) == (subReader.getInt16Field())",
                 (DebugComparison<int,_short> *)local_470,&local_480,
                 (short *)&_kjCondition_18.field_0x1e);
      local_47b = false;
    }
  }
  iStack_4b0 = -0x4b3eff2;
  local_4ac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffb50);
  local_4b4 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_4a8,&local_4ac,&local_4b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4a8);
  if (!bVar1) {
    local_4b5 = kj::_::Debug::shouldLog(ERROR);
    while (local_4b5 != false) {
      _kjCondition_19._36_4_ = 0xfb4c100e;
      _kjCondition_19._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt32Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"(-78901234) == (subReader.getInt32Field())\", _kjCondition, -78901234, subReader.getInt32Field()"
                 ,(char (*) [60])"failed: expected (-78901234) == (subReader.getInt32Field())",
                 (DebugComparison<int,_int> *)local_4a8,(int *)&_kjCondition_19.field_0x24,
                 (int *)&_kjCondition_19.result);
      local_4b5 = false;
    }
  }
  local_4f8 = 0x33a638e8734e;
  local_4f0 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_4f8);
  iStack_500 = capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                         ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long> *)local_4e8,&local_4f0,&stack0xfffffffffffffb00);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4e8);
  if (!bVar1) {
    local_501 = kj::_::Debug::shouldLog(ERROR);
    while (local_501 != false) {
      local_510 = 0x33a638e8734e;
      _kjCondition_20._24_8_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getInt64Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<long_long,long>&,long_long,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf0,ERROR,
                 "\"failed: expected \" \"(56789012345678ll) == (subReader.getInt64Field())\", _kjCondition, 56789012345678ll, subReader.getInt64Field()"
                 ,(char (*) [67])
                  "failed: expected (56789012345678ll) == (subReader.getInt64Field())",
                 (DebugComparison<long_long,_long> *)local_4e8,&local_510,
                 (long *)&_kjCondition_20.result);
      local_501 = false;
    }
  }
  local_540 = 0x5a;
  DStack_53c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_540);
  local_541 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_538,&stack0xfffffffffffffac4,
             &local_541);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_538);
  if (!bVar1) {
    local_542 = kj::_::Debug::shouldLog(ERROR);
    while (local_542 != false) {
      local_548 = 0x5a;
      _kjCondition_21._31_1_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"(90u) == (subReader.getUInt8Field())\", _kjCondition, 90u, subReader.getUInt8Field()"
                 ,(char (*) [54])"failed: expected (90u) == (subReader.getUInt8Field())",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_538,&local_548,
                 &_kjCondition_21.field_0x1f);
      local_542 = false;
    }
  }
  local_578 = 0x4d2;
  DStack_574 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_578);
  local_57a = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_570,&stack0xfffffffffffffa8c,
             &local_57a);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_570);
  if (!bVar1) {
    local_57b = kj::_::Debug::shouldLog(ERROR);
    while (local_57b != false) {
      local_580 = 0x4d2;
      _kjCondition_22._30_2_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf2,ERROR,
                 "\"failed: expected \" \"(1234u) == (subReader.getUInt16Field())\", _kjCondition, 1234u, subReader.getUInt16Field()"
                 ,(char (*) [57])"failed: expected (1234u) == (subReader.getUInt16Field())",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_570,&local_580,
                 (unsigned_short *)&_kjCondition_22.field_0x1e);
      local_57b = false;
    }
  }
  uStack_5b0 = 0x3628814;
  local_5ac = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffa50);
  local_5b4 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_5a8,&local_5ac,&local_5b4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5a8);
  if (!bVar1) {
    local_5b5 = kj::_::Debug::shouldLog(ERROR);
    while (local_5b5 != false) {
      _kjCondition_23._36_4_ = 0x3628814;
      _kjCondition_23._32_4_ =
           capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32Field
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf3,ERROR,
                 "\"failed: expected \" \"(56789012u) == (subReader.getUInt32Field())\", _kjCondition, 56789012u, subReader.getUInt32Field()"
                 ,(char (*) [61])"failed: expected (56789012u) == (subReader.getUInt32Field())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_5a8,
                 (uint *)&_kjCondition_23.field_0x24,(uint *)&_kjCondition_23.result);
      local_5b5 = false;
    }
  }
  local_5f8 = 0x4cc1921126f0ad2;
  local_5f0 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5f8);
  uStack_600 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                         ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_5e8,&local_5f0,
             &stack0xfffffffffffffa00);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5e8);
  if (!bVar1) {
    local_601 = kj::_::Debug::shouldLog(ERROR);
    while (local_601 != false) {
      local_610 = 0x4cc1921126f0ad2;
      uStack_618 = capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64Field
                             ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[73],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf4,ERROR,
                 "\"failed: expected \" \"(345678901234567890ull) == (subReader.getUInt64Field())\", _kjCondition, 345678901234567890ull, subReader.getUInt64Field()"
                 ,(char (*) [73])
                  "failed: expected (345678901234567890ull) == (subReader.getUInt64Field())",
                 (DebugComparison<unsigned_long_long,_unsigned_long> *)local_5e8,&local_610,
                 &stack0xfffffffffffff9e8);
      local_601 = false;
    }
  }
  fVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                    ((Builder *)&_kjCondition_14.result);
  local_61a = kj::_::floatAlmostEqual(fVar2,-1.25e-10);
  local_619 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_61a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_619);
  if (!bVar1) {
    local_61b = kj::_::Debug::shouldLog(ERROR);
    while (local_61b != false) {
      fStack_620 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32Field
                             ((Builder *)&_kjCondition_14.result);
      local_624 = -1.25e-10;
      kj::_::Debug::log<char_const(&)[84],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)\", _kjCondition, subReader.getFloat32Field(), -1.25e-10f"
                 ,(char (*) [84])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)"
                 ,&local_619,&stack0xfffffffffffff9e0,&local_624);
      local_61b = false;
    }
  }
  dVar3 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                    ((Builder *)&_kjCondition_14.result);
  local_626 = kj::_::doubleAlmostEqual(dVar3,345.0);
  local_625 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_626);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_625);
  if (!bVar1) {
    local_627 = kj::_::Debug::shouldLog(ERROR);
    while (local_627 != false) {
      local_630 = capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64Field
                            ((Builder *)&_kjCondition_14.result);
      _kjCondition_26._52_4_ = 0x159;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)\", _kjCondition, subReader.getFloat64Field(), 345"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)",
                 &local_625,&local_630,(int *)&_kjCondition_26.field_0x34);
      local_627 = false;
    }
  }
  local_678 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x442cda);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_690,(Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_670,
             (DebugExpression<char_const(&)[4]> *)&local_678,(Builder *)local_690);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_670);
  if (!bVar1) {
    local_691 = kj::_::Debug::shouldLog(ERROR);
    while (local_691 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                ((Builder *)&_kjCondition_27.result,(Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf7,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (subReader.getTextField())\", _kjCondition, \"baz\", subReader.getTextField()"
                 ,(char (*) [55])"failed: expected (\"baz\") == (subReader.getTextField())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_670,
                 (char (*) [4])0x442cda,(Builder *)&_kjCondition_27.result);
      local_691 = false;
    }
  }
  local_708 = (ArrayPtr<const_unsigned_char>)_::data("qux");
  local_6f8 = (ArrayPtr<const_unsigned_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_708);
  _auStack_718 = (ArrayPtr<unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                           ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_6e8,
             (DebugExpression<capnp::Data::Reader> *)&local_6f8,(Builder *)auStack_718);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6e8);
  if (!bVar1) {
    local_719 = kj::_::Debug::shouldLog(ERROR);
    while (local_719 != false) {
      local_730 = (ArrayPtr<const_unsigned_char>)_::data("qux");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Builder::getDataField
                     ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf8,ERROR,
                 "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.getDataField())\", _kjCondition, data(\"qux\"), subReader.getDataField()"
                 ,(char (*) [61])"failed: expected (data(\"qux\")) == (subReader.getDataField())",
                 (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_6e8,
                 (Reader *)&local_730,(Builder *)&subSubReader._builder.dataSize);
      local_719 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)&_kjCondition_28.result,(Builder *)&_kjCondition_14.result);
  local_7a8 = (char (*) [7])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [7])0x452f2b);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
            ((Builder *)local_7c0,(Builder *)&_kjCondition_28.result);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_7a0,
             (DebugExpression<char_const(&)[7]> *)&local_7a8,(Builder *)local_7c0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7a0);
  if (!bVar1) {
    local_7c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_7c1 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                ((Builder *)&_kjCondition_29.result,(Builder *)&_kjCondition_28.result);
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Builder>&,char_const(&)[7],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xfb,ERROR,
                 "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.getTextField())\", _kjCondition, \"nested\", subSubReader.getTextField()"
                 ,(char (*) [61])"failed: expected (\"nested\") == (subSubReader.getTextField())",
                 (DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_7a0,
                 (char (*) [7])0x452f2b,(Builder *)&_kjCondition_29.result);
      local_7c1 = false;
    }
  }
  local_820 = (char (*) [14])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [14])"really nested"
                        );
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
            ((Builder *)local_860,(Builder *)&_kjCondition_28.result);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_838,(Builder *)local_860);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            ((DebugComparison<const_char_(&)[14],_capnp::Text::Builder> *)local_818,
             (DebugExpression<char_const(&)[14]> *)&local_820,&local_838);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_818);
  if (!bVar1) {
    local_861 = kj::_::Debug::shouldLog(ERROR);
    while (local_861 != false) {
      capnproto_test::capnp::test::TestAllTypes::Builder::getStructField
                ((Builder *)&_kjCondition_30.result,(Builder *)&_kjCondition_28.result);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_880,(Builder *)&_kjCondition_30.result);
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Builder>&,char_const(&)[14],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xfc,ERROR,
                 "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"really nested\", subSubReader.getStructField().getTextField()"
                 ,(char (*) [85])
                  "failed: expected (\"really nested\") == (subSubReader.getStructField().getTextField())"
                 ,(DebugComparison<const_char_(&)[14],_capnp::Text::Builder> *)local_818,
                 (char (*) [14])"really nested",&local_880);
      local_861 = false;
    }
  }
  local_8cc = BAZ;
  local_8ca = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_8cc);
  local_8ce = capnproto_test::capnp::test::TestAllTypes::Builder::getEnumField
                        ((Builder *)&_kjCondition_14.result);
  kj::_::DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3>::operator==
            ((DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              *)&local_8c8,&local_8ca,&local_8ce);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_8c8);
  if (!bVar1) {
    local_8cf = kj::_::Debug::shouldLog(ERROR);
    while (local_8cf != false) {
      local_8d2 = BAZ;
      local_8d4 = capnproto_test::capnp::test::TestAllTypes::Builder::getEnumField
                            ((Builder *)&_kjCondition_14.result);
      kj::_::Debug::
      log<char_const(&)[63],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xfe,ERROR,
                 "\"failed: expected \" \"(TestEnum::BAZ) == (subReader.getEnumField())\", _kjCondition, TestEnum::BAZ, subReader.getEnumField()"
                 ,(char (*) [63])"failed: expected (TestEnum::BAZ) == (subReader.getEnumField())",
                 (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  *)&local_8c8,&local_8d2,&local_8d4);
      local_8cf = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getVoidList
            (&local_900,(Builder *)&_kjCondition_14.result);
  local_910 = local_913;
  local_908 = 3;
  expected_25._M_len = 3;
  expected_25._M_array = local_910;
  reader_00.builder.capTable = local_900.builder.capTable;
  reader_00.builder.segment = local_900.builder.segment;
  reader_00.builder.ptr = local_900.builder.ptr;
  reader_00.builder.elementCount = local_900.builder.elementCount;
  reader_00.builder.step = local_900.builder.step;
  reader_00.builder.structDataSize = local_900.builder.structDataSize;
  reader_00.builder.structPointerCount = local_900.builder.structPointerCount;
  reader_00.builder.elementSize = local_900.builder.elementSize;
  reader_00.builder._39_1_ = local_900.builder._39_1_;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_00,expected_25);
  capnproto_test::capnp::test::TestAllTypes::Builder::getBoolList
            (&local_940,(Builder *)&_kjCondition_14.result);
  local_955[0] = false;
  local_955[1] = true;
  local_955[2] = false;
  local_955[3] = true;
  local_955[4] = true;
  local_950 = local_955;
  local_948 = 5;
  expected_24._M_len = 5;
  expected_24._M_array = local_950;
  reader_01.builder.capTable = local_940.builder.capTable;
  reader_01.builder.segment = local_940.builder.segment;
  reader_01.builder.ptr = local_940.builder.ptr;
  reader_01.builder.elementCount = local_940.builder.elementCount;
  reader_01.builder.step = local_940.builder.step;
  reader_01.builder.structDataSize = local_940.builder.structDataSize;
  reader_01.builder.structPointerCount = local_940.builder.structPointerCount;
  reader_01.builder.elementSize = local_940.builder.elementSize;
  reader_01.builder._39_1_ = local_940.builder._39_1_;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
            (reader_01,expected_24);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt8List
            (&local_980,(Builder *)&_kjCondition_14.result);
  builtin_strncpy(local_994,"\fހ\x7f",4);
  local_990 = local_994;
  local_988 = 4;
  expected_23._M_len = 4;
  expected_23._M_array = local_990;
  reader_02.builder.capTable = local_980.builder.capTable;
  reader_02.builder.segment = local_980.builder.segment;
  reader_02.builder.ptr = local_980.builder.ptr;
  reader_02.builder.elementCount = local_980.builder.elementCount;
  reader_02.builder.step = local_980.builder.step;
  reader_02.builder.structDataSize = local_980.builder.structDataSize;
  reader_02.builder.structPointerCount = local_980.builder.structPointerCount;
  reader_02.builder.elementSize = local_980.builder.elementSize;
  reader_02.builder._39_1_ = local_980.builder._39_1_;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Builder,_capnp::List<signed_char,_(capnp::Kind)0>,_false>
            (reader_02,expected_23);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt16List
            (&local_9c0,(Builder *)&_kjCondition_14.result);
  local_9d8[0] = 0x4d2;
  local_9d8[1] = 0xe9d2;
  local_9d8[2] = 0x8000;
  local_9d8[3] = 0x7fff;
  local_9d0 = local_9d8;
  local_9c8 = 4;
  expected_22._M_len = 4;
  expected_22._M_array = local_9d0;
  reader_03.builder.capTable = local_9c0.builder.capTable;
  reader_03.builder.segment = local_9c0.builder.segment;
  reader_03.builder.ptr = local_9c0.builder.ptr;
  reader_03.builder.elementCount = local_9c0.builder.elementCount;
  reader_03.builder.step = local_9c0.builder.step;
  reader_03.builder.structDataSize = local_9c0.builder.structDataSize;
  reader_03.builder.structPointerCount = local_9c0.builder.structPointerCount;
  reader_03.builder.elementSize = local_9c0.builder.elementSize;
  reader_03.builder._39_1_ = local_9c0.builder._39_1_;
  checkList<capnp::List<short,_(capnp::Kind)0>::Builder,_capnp::List<short,_(capnp::Kind)0>,_false>
            (reader_03,expected_22);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt32List
            (&local_a00,(Builder *)&_kjCondition_14.result);
  local_a20[0] = 0xbc614e;
  local_a20[1] = 0xfaa0d340;
  local_a20[2] = 0x80000000;
  local_a20[3] = 0x7fffffff;
  local_a10 = local_a20;
  local_a08 = 4;
  expected_21._M_len = 4;
  expected_21._M_array = local_a10;
  reader_04.builder.capTable = local_a00.builder.capTable;
  reader_04.builder.segment = local_a00.builder.segment;
  reader_04.builder.ptr = local_a00.builder.ptr;
  reader_04.builder.elementCount = local_a00.builder.elementCount;
  reader_04.builder.step = local_a00.builder.step;
  reader_04.builder.structDataSize = local_a00.builder.structDataSize;
  reader_04.builder.structPointerCount = local_a00.builder.structPointerCount;
  reader_04.builder.elementSize = local_a00.builder.elementSize;
  reader_04.builder._39_1_ = local_a00.builder._39_1_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader_04,expected_21);
  capnproto_test::capnp::test::TestAllTypes::Builder::getInt64List
            (&local_a48,(Builder *)&_kjCondition_14.result);
  local_a78[0] = 0x7048860ddf79;
  local_a78[1] = 0xfffd968afd13752e;
  local_a78[2] = 0x8000000000000000;
  local_a78[3] = 0x7fffffffffffffff;
  local_a58 = local_a78;
  local_a50 = 4;
  expected_20._M_len = 4;
  expected_20._M_array = local_a58;
  reader_05.builder.capTable = local_a48.builder.capTable;
  reader_05.builder.segment = local_a48.builder.segment;
  reader_05.builder.ptr = local_a48.builder.ptr;
  reader_05.builder.elementCount = local_a48.builder.elementCount;
  reader_05.builder.step = local_a48.builder.step;
  reader_05.builder.structDataSize = local_a48.builder.structDataSize;
  reader_05.builder.structPointerCount = local_a48.builder.structPointerCount;
  reader_05.builder.elementSize = local_a48.builder.elementSize;
  reader_05.builder._39_1_ = local_a48.builder._39_1_;
  checkList<capnp::List<long,_(capnp::Kind)0>::Builder,_capnp::List<long,_(capnp::Kind)0>,_false>
            (reader_05,expected_20);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt8List
            (&local_aa0,(Builder *)&_kjCondition_14.result);
  local_ab4[0] = '\f';
  local_ab4[1] = 0x22;
  local_ab4[2] = 0;
  local_ab4[3] = 0xff;
  local_ab0 = local_ab4;
  local_aa8 = 4;
  expected_19._M_len = 4;
  expected_19._M_array = local_ab0;
  reader_06.builder.capTable = local_aa0.builder.capTable;
  reader_06.builder.segment = local_aa0.builder.segment;
  reader_06.builder.ptr = local_aa0.builder.ptr;
  reader_06.builder.elementCount = local_aa0.builder.elementCount;
  reader_06.builder.step = local_aa0.builder.step;
  reader_06.builder.structDataSize = local_aa0.builder.structDataSize;
  reader_06.builder.structPointerCount = local_aa0.builder.structPointerCount;
  reader_06.builder.elementSize = local_aa0.builder.elementSize;
  reader_06.builder._39_1_ = local_aa0.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_06,expected_19);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt16List
            (&local_ae0,(Builder *)&_kjCondition_14.result);
  local_af8[0] = 0x4d2;
  local_af8[1] = 0x162e;
  local_af8[2] = 0;
  local_af8[3] = 0xffff;
  local_af0 = local_af8;
  local_ae8 = 4;
  expected_18._M_len = 4;
  expected_18._M_array = local_af0;
  reader_07.builder.capTable = local_ae0.builder.capTable;
  reader_07.builder.segment = local_ae0.builder.segment;
  reader_07.builder.ptr = local_ae0.builder.ptr;
  reader_07.builder.elementCount = local_ae0.builder.elementCount;
  reader_07.builder.step = local_ae0.builder.step;
  reader_07.builder.structDataSize = local_ae0.builder.structDataSize;
  reader_07.builder.structPointerCount = local_ae0.builder.structPointerCount;
  reader_07.builder.elementSize = local_ae0.builder.elementSize;
  reader_07.builder._39_1_ = local_ae0.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_07,expected_18);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt32List
            (&local_b20,(Builder *)&_kjCondition_14.result);
  local_b40[0] = 0xbc614e;
  local_b40[1] = 0x55f2cc0;
  local_b40[2] = 0;
  local_b40[3] = 0xffffffff;
  local_b30 = local_b40;
  local_b28 = 4;
  expected_17._M_len = 4;
  expected_17._M_array = local_b30;
  reader_08.builder.capTable = local_b20.builder.capTable;
  reader_08.builder.segment = local_b20.builder.segment;
  reader_08.builder.ptr = local_b20.builder.ptr;
  reader_08.builder.elementCount = local_b20.builder.elementCount;
  reader_08.builder.step = local_b20.builder.step;
  reader_08.builder.structDataSize = local_b20.builder.structDataSize;
  reader_08.builder.structPointerCount = local_b20.builder.structPointerCount;
  reader_08.builder.elementSize = local_b20.builder.elementSize;
  reader_08.builder._39_1_ = local_b20.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_08,expected_17);
  capnproto_test::capnp::test::TestAllTypes::Builder::getUInt64List
            (&local_b68,(Builder *)&_kjCondition_14.result);
  local_b98[0] = 0x7048860ddf79;
  local_b98[1] = 0x2697502ec8ad2;
  local_b98[2] = 0;
  local_b98[3] = 0xffffffffffffffff;
  local_b78 = local_b98;
  local_b70 = 4;
  expected_16._M_len = 4;
  expected_16._M_array = local_b78;
  reader_09.builder.capTable = local_b68.builder.capTable;
  reader_09.builder.segment = local_b68.builder.segment;
  reader_09.builder.ptr = local_b68.builder.ptr;
  reader_09.builder.elementCount = local_b68.builder.elementCount;
  reader_09.builder.step = local_b68.builder.step;
  reader_09.builder.structDataSize = local_b68.builder.structDataSize;
  reader_09.builder.structPointerCount = local_b68.builder.structPointerCount;
  reader_09.builder.elementSize = local_b68.builder.elementSize;
  reader_09.builder._39_1_ = local_b68.builder._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_09,expected_16);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat32List
            (&local_bc0,(Builder *)&_kjCondition_14.result);
  local_be8[0] = 0.0;
  local_be8[1] = 1234567.0;
  local_be8[2] = 1e+37;
  local_be8[3] = -1e+37;
  local_be8[4] = 1e-37;
  local_be8[5] = -1e-37;
  local_bd0 = local_be8;
  local_bc8 = 6;
  expected_15._M_len = 6;
  expected_15._M_array = local_bd0;
  reader_10.builder.capTable = local_bc0.builder.capTable;
  reader_10.builder.segment = local_bc0.builder.segment;
  reader_10.builder.ptr = local_bc0.builder.ptr;
  reader_10.builder.elementCount = local_bc0.builder.elementCount;
  reader_10.builder.step = local_bc0.builder.step;
  reader_10.builder.structDataSize = local_bc0.builder.structDataSize;
  reader_10.builder.structPointerCount = local_bc0.builder.structPointerCount;
  reader_10.builder.elementSize = local_bc0.builder.elementSize;
  reader_10.builder._39_1_ = local_bc0.builder._39_1_;
  checkList<capnp::List<float,_(capnp::Kind)0>::Builder,_capnp::List<float,_(capnp::Kind)0>,_false>
            (reader_10,expected_15);
  capnproto_test::capnp::test::TestAllTypes::Builder::getFloat64List
            (&local_c10,(Builder *)&_kjCondition_14.result);
  memcpy(local_c50,&DAT_00461530,0x30);
  local_c20 = local_c50;
  local_c18 = 6;
  expected_14._M_len = 6;
  expected_14._M_array = local_c20;
  reader_11.builder.capTable = local_c10.builder.capTable;
  reader_11.builder.segment = local_c10.builder.segment;
  reader_11.builder.ptr = local_c10.builder.ptr;
  reader_11.builder.elementCount = local_c10.builder.elementCount;
  reader_11.builder.step = local_c10.builder.step;
  reader_11.builder.structDataSize = local_c10.builder.structDataSize;
  reader_11.builder.structPointerCount = local_c10.builder.structPointerCount;
  reader_11.builder.elementSize = local_c10.builder.elementSize;
  reader_11.builder._39_1_ = local_c10.builder._39_1_;
  checkList<capnp::List<double,_(capnp::Kind)0>::Builder,_capnp::List<double,_(capnp::Kind)0>,_false>
            (reader_11,expected_14);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextList
            (&local_c78,(Builder *)&_kjCondition_14.result);
  Text::Reader::Reader(&local_cb8,"quux");
  Text::Reader::Reader(&RStack_ca8,"corge");
  Text::Reader::Reader(&RStack_c98,"grault");
  local_c88 = &local_cb8;
  local_c80 = 3;
  expected_13._M_len = 3;
  expected_13._M_array = local_c88;
  reader_12.builder.capTable = local_c78.builder.capTable;
  reader_12.builder.segment = local_c78.builder.segment;
  reader_12.builder.ptr = local_c78.builder.ptr;
  reader_12.builder.elementCount = local_c78.builder.elementCount;
  reader_12.builder.step = local_c78.builder.step;
  reader_12.builder.structDataSize = local_c78.builder.structDataSize;
  reader_12.builder.structPointerCount = local_c78.builder.structPointerCount;
  reader_12.builder.elementSize = local_c78.builder.elementSize;
  reader_12.builder._39_1_ = local_c78.builder._39_1_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_12,expected_13);
  capnproto_test::capnp::test::TestAllTypes::Builder::getDataList
            (&local_ce0,(Builder *)&_kjCondition_14.result);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("garply");
  _::data("waldo");
  _::data("fred");
  expected_12._M_len = 3;
  expected_12._M_array = (iterator)&listReader.builder.structDataSize;
  reader_13.builder.capTable = local_ce0.builder.capTable;
  reader_13.builder.segment = local_ce0.builder.segment;
  reader_13.builder.ptr = local_ce0.builder.ptr;
  reader_13.builder.elementCount = local_ce0.builder.elementCount;
  reader_13.builder.step = local_ce0.builder.step;
  reader_13.builder.structDataSize = local_ce0.builder.structDataSize;
  reader_13.builder.structPointerCount = local_ce0.builder.structPointerCount;
  reader_13.builder.elementSize = local_ce0.builder.elementSize;
  reader_13.builder._39_1_ = local_ce0.builder._39_1_;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
            (reader_13,expected_12);
  capnproto_test::capnp::test::TestAllTypes::Builder::getStructList
            ((Builder *)&_kjCondition_31.result,(Builder *)&_kjCondition_14.result);
  local_d70 = 3;
  local_d6c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d70);
  f.exception._4_4_ =
       List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                 ((Builder *)&_kjCondition_31.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_d68,&local_d6c,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d68);
  if (!bVar1) {
    local_d84 = 3;
    local_d88 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                          ((Builder *)&_kjCondition_31.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_d80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x111,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_d68,&local_d84,&local_d88);
    kj::_::Debug::Fault::fatal(&local_d80);
  }
  local_dd8 = (char (*) [15])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [15])"x structlist 1");
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_e18,(Builder *)&_kjCondition_31.result,0);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_df0,(Builder *)local_e18);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_dd0,
             (DebugExpression<char_const(&)[15]> *)&local_dd8,&local_df0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_dd0);
  if (!bVar1) {
    local_e19 = kj::_::Debug::shouldLog(ERROR);
    while (local_e19 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                ((Builder *)&_kjCondition_33.result,(Builder *)&_kjCondition_31.result,0);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_e38,(Builder *)&_kjCondition_33.result);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x112,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"x structlist 1\", listReader[0].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 1\") == (listReader[0].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_dd0,
                 (char (*) [15])"x structlist 1",&local_e38);
      local_e19 = false;
    }
  }
  local_ea0 = (char (*) [15])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [15])"x structlist 2");
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_ee0,(Builder *)&_kjCondition_31.result,1);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_eb8,(Builder *)local_ee0);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_e98,
             (DebugExpression<char_const(&)[15]> *)&local_ea0,&local_eb8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e98);
  if (!bVar1) {
    local_ee1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ee1 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                ((Builder *)&_kjCondition_34.result,(Builder *)&_kjCondition_31.result,1);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                (&local_f00,(Builder *)&_kjCondition_34.result);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x113,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"x structlist 2\", listReader[1].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 2\") == (listReader[1].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_e98,
                 (char (*) [15])"x structlist 2",&local_f00);
      local_ee1 = false;
    }
  }
  local_f68 = (char (*) [15])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                         (char (*) [15])"x structlist 3");
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            ((Builder *)local_fa8,(Builder *)&_kjCondition_31.result,2);
  capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_f80,(Builder *)local_fa8);
  kj::_::DebugExpression<char_const(&)[15]>::operator==
            ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_f60,
             (DebugExpression<char_const(&)[15]> *)&local_f68,&local_f80);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_f60);
  if (!bVar1) {
    local_fa9 = kj::_::Debug::shouldLog(ERROR);
    while (local_fa9 != false) {
      List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                (&local_ff0,(Builder *)&_kjCondition_31.result,2);
      capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_fc8,&local_ff0);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x114,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"x structlist 3\", listReader[2].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 3\") == (listReader[2].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_f60,
                 (char (*) [15])"x structlist 3",&local_fc8);
      local_fa9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::getEnumList
            (&local_1018,(Builder *)&_kjCondition_14.result);
  _kjCondition_35._26_2_ = 3;
  _kjCondition_35._28_2_ = 1;
  _kjCondition_35._30_2_ = 6;
  expected_11._M_len = 3;
  expected_11._M_array = (iterator)&_kjCondition_35.field_0x1a;
  reader_14.builder.capTable = local_1018.builder.capTable;
  reader_14.builder.segment = local_1018.builder.segment;
  reader_14.builder.ptr = local_1018.builder.ptr;
  reader_14.builder.elementCount = local_1018.builder.elementCount;
  reader_14.builder.step = local_1018.builder.step;
  reader_14.builder.structDataSize = local_1018.builder.structDataSize;
  reader_14.builder.structPointerCount = local_1018.builder.structPointerCount;
  reader_14.builder.elementSize = local_1018.builder.elementSize;
  reader_14.builder._39_1_ = local_1018.builder._39_1_;
  checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Builder,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_false>
            (reader_14,expected_11);
  local_1054 = CORGE;
  local_1052 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1054);
  local_1056 = capnproto_test::capnp::test::TestDefaults::Builder::getEnumField
                         ((Builder *)&stack0x00000008);
  kj::_::DebugExpression<capnp::schemas::TestEnum_9c8e9318b29d9cd3>::operator==
            ((DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              *)&local_1050,&local_1052,&local_1056);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_1050);
  if (!bVar1) {
    local_1057 = kj::_::Debug::shouldLog(ERROR);
    while (local_1057 != false) {
      _kjCondition_36._30_2_ = 5;
      _kjCondition_36._28_2_ =
           capnproto_test::capnp::test::TestDefaults::Builder::getEnumField
                     ((Builder *)&stack0x00000008);
      kj::_::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x118,ERROR,
                 "\"failed: expected \" \"(TestEnum::CORGE) == (reader.getEnumField())\", _kjCondition, TestEnum::CORGE, reader.getEnumField()"
                 ,(char (*) [62])"failed: expected (TestEnum::CORGE) == (reader.getEnumField())",
                 (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  *)&local_1050,(TestEnum_9c8e9318b29d9cd3 *)&_kjCondition_36.field_0x1e,
                 (TestEnum_9c8e9318b29d9cd3 *)&_kjCondition_36.field_0x1c);
      local_1057 = false;
    }
  }
  local_1088 = 6;
  local_1084 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1088);
  capnproto_test::capnp::test::TestDefaults::Builder::getVoidList
            ((Builder *)local_10b8,(Builder *)&stack0x00000008);
  local_108c = List<capnp::Void,_(capnp::Kind)0>::Builder::size((Builder *)local_10b8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1080,&local_1084,&local_108c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1080);
  if (!bVar1) {
    local_10b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_10b9 != false) {
      local_10c0 = 6;
      capnproto_test::capnp::test::TestDefaults::Builder::getVoidList
                (&local_10f0,(Builder *)&stack0x00000008);
      local_10c4 = List<capnp::Void,_(capnp::Kind)0>::Builder::size(&local_10f0);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x11a,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.getVoidList().size())\", _kjCondition, 6u, reader.getVoidList().size()"
                 ,(char (*) [55])"failed: expected (6u) == (reader.getVoidList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_1080,&local_10c0,&local_10c4);
      local_10b9 = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getBoolList
            (&local_1118,(Builder *)&stack0x00000008);
  local_112c[0] = true;
  local_112c[1] = false;
  local_112c[2] = false;
  local_112c[3] = true;
  local_1128 = local_112c;
  local_1120 = 4;
  expected_10._M_len = 4;
  expected_10._M_array = local_1128;
  reader_15.builder.capTable = local_1118.builder.capTable;
  reader_15.builder.segment = local_1118.builder.segment;
  reader_15.builder.ptr = local_1118.builder.ptr;
  reader_15.builder.elementCount = local_1118.builder.elementCount;
  reader_15.builder.step = local_1118.builder.step;
  reader_15.builder.structDataSize = local_1118.builder.structDataSize;
  reader_15.builder.structPointerCount = local_1118.builder.structPointerCount;
  reader_15.builder.elementSize = local_1118.builder.elementSize;
  reader_15.builder._39_1_ = local_1118.builder._39_1_;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
            (reader_15,expected_10);
  capnproto_test::capnp::test::TestDefaults::Builder::getInt8List
            (&local_1158,(Builder *)&stack0x00000008);
  local_116a[0] = 'o';
  local_116a[1] = 0x91;
  local_1168 = local_116a;
  local_1160 = 2;
  expected_09._M_len = 2;
  expected_09._M_array = local_1168;
  reader_16.builder.capTable = local_1158.builder.capTable;
  reader_16.builder.segment = local_1158.builder.segment;
  reader_16.builder.ptr = local_1158.builder.ptr;
  reader_16.builder.elementCount = local_1158.builder.elementCount;
  reader_16.builder.step = local_1158.builder.step;
  reader_16.builder.structDataSize = local_1158.builder.structDataSize;
  reader_16.builder.structPointerCount = local_1158.builder.structPointerCount;
  reader_16.builder.elementSize = local_1158.builder.elementSize;
  reader_16.builder._39_1_ = local_1158.builder._39_1_;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Builder,_capnp::List<signed_char,_(capnp::Kind)0>,_false>
            (reader_16,expected_09);
  capnproto_test::capnp::test::TestDefaults::Builder::getInt16List
            (&local_1198,(Builder *)&stack0x00000008);
  local_11ac[0] = 0x2b67;
  local_11ac[1] = 0xd499;
  local_11a8 = local_11ac;
  local_11a0 = 2;
  expected_08._M_len = 2;
  expected_08._M_array = local_11a8;
  reader_17.builder.capTable = local_1198.builder.capTable;
  reader_17.builder.segment = local_1198.builder.segment;
  reader_17.builder.ptr = local_1198.builder.ptr;
  reader_17.builder.elementCount = local_1198.builder.elementCount;
  reader_17.builder.step = local_1198.builder.step;
  reader_17.builder.structDataSize = local_1198.builder.structDataSize;
  reader_17.builder.structPointerCount = local_1198.builder.structPointerCount;
  reader_17.builder.elementSize = local_1198.builder.elementSize;
  reader_17.builder._39_1_ = local_1198.builder._39_1_;
  checkList<capnp::List<short,_(capnp::Kind)0>::Builder,_capnp::List<short,_(capnp::Kind)0>,_false>
            (reader_17,expected_08);
  capnproto_test::capnp::test::TestDefaults::Builder::getInt32List
            (&local_11d8,(Builder *)&stack0x00000008);
  local_11f0[0] = 0x69f6bc7;
  local_11f0[1] = 0xf9609439;
  local_11e8 = local_11f0;
  local_11e0 = 2;
  expected_07._M_len = 2;
  expected_07._M_array = local_11e8;
  reader_18.builder.capTable = local_11d8.builder.capTable;
  reader_18.builder.segment = local_11d8.builder.segment;
  reader_18.builder.ptr = local_11d8.builder.ptr;
  reader_18.builder.elementCount = local_11d8.builder.elementCount;
  reader_18.builder.step = local_11d8.builder.step;
  reader_18.builder.structDataSize = local_11d8.builder.structDataSize;
  reader_18.builder.structPointerCount = local_11d8.builder.structPointerCount;
  reader_18.builder.elementSize = local_11d8.builder.elementSize;
  reader_18.builder._39_1_ = local_11d8.builder._39_1_;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader_18,expected_07);
  capnproto_test::capnp::test::TestDefaults::Builder::getInt64List
            (&local_1218,(Builder *)&stack0x00000008);
  local_1238[0] = 0xf6b75ab2bc471c7;
  local_1238[1] = 0xf0948a54d43b8e39;
  local_1228 = local_1238;
  local_1220 = 2;
  expected_06._M_len = 2;
  expected_06._M_array = local_1228;
  reader_19.builder.capTable = local_1218.builder.capTable;
  reader_19.builder.segment = local_1218.builder.segment;
  reader_19.builder.ptr = local_1218.builder.ptr;
  reader_19.builder.elementCount = local_1218.builder.elementCount;
  reader_19.builder.step = local_1218.builder.step;
  reader_19.builder.structDataSize = local_1218.builder.structDataSize;
  reader_19.builder.structPointerCount = local_1218.builder.structPointerCount;
  reader_19.builder.elementSize = local_1218.builder.elementSize;
  reader_19.builder._39_1_ = local_1218.builder._39_1_;
  checkList<capnp::List<long,_(capnp::Kind)0>::Builder,_capnp::List<long,_(capnp::Kind)0>,_false>
            (reader_19,expected_06);
  capnproto_test::capnp::test::TestDefaults::Builder::getUInt8List
            (&local_1260,(Builder *)&stack0x00000008);
  local_1272[0] = 'o';
  local_1272[1] = 0xde;
  local_1270 = local_1272;
  local_1268 = 2;
  expected_05._M_len = 2;
  expected_05._M_array = local_1270;
  reader_20.builder.capTable = local_1260.builder.capTable;
  reader_20.builder.segment = local_1260.builder.segment;
  reader_20.builder.ptr = local_1260.builder.ptr;
  reader_20.builder.elementCount = local_1260.builder.elementCount;
  reader_20.builder.step = local_1260.builder.step;
  reader_20.builder.structDataSize = local_1260.builder.structDataSize;
  reader_20.builder.structPointerCount = local_1260.builder.structPointerCount;
  reader_20.builder.elementSize = local_1260.builder.elementSize;
  reader_20.builder._39_1_ = local_1260.builder._39_1_;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_20,expected_05);
  capnproto_test::capnp::test::TestDefaults::Builder::getUInt16List
            (&local_12a0,(Builder *)&stack0x00000008);
  local_12b4[0] = 0x8235;
  local_12b4[1] = 0xad9c;
  local_12b0 = local_12b4;
  local_12a8 = 2;
  expected_04._M_len = 2;
  expected_04._M_array = local_12b0;
  reader_21.builder.capTable = local_12a0.builder.capTable;
  reader_21.builder.segment = local_12a0.builder.segment;
  reader_21.builder.ptr = local_12a0.builder.ptr;
  reader_21.builder.elementCount = local_12a0.builder.elementCount;
  reader_21.builder.step = local_12a0.builder.step;
  reader_21.builder.structDataSize = local_12a0.builder.structDataSize;
  reader_21.builder.structPointerCount = local_12a0.builder.structPointerCount;
  reader_21.builder.elementSize = local_12a0.builder.elementSize;
  reader_21.builder._39_1_ = local_12a0.builder._39_1_;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_21,expected_04);
  capnproto_test::capnp::test::TestDefaults::Builder::getUInt32List
            (&local_12e0,(Builder *)&stack0x00000008);
  local_12f4 = 0xc6aea155;
  local_12f0 = &local_12f4;
  local_12e8 = 1;
  expected_03._M_len = 1;
  expected_03._M_array = local_12f0;
  reader_22.builder.capTable = local_12e0.builder.capTable;
  reader_22.builder.segment = local_12e0.builder.segment;
  reader_22.builder.ptr = local_12e0.builder.ptr;
  reader_22.builder.elementCount = local_12e0.builder.elementCount;
  reader_22.builder.step = local_12e0.builder.step;
  reader_22.builder.structDataSize = local_12e0.builder.structDataSize;
  reader_22.builder.structPointerCount = local_12e0.builder.structPointerCount;
  reader_22.builder.elementSize = local_12e0.builder.elementSize;
  reader_22.builder._39_1_ = local_12e0.builder._39_1_;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_22,expected_03);
  capnproto_test::capnp::test::TestDefaults::Builder::getUInt64List
            (&local_1320,(Builder *)&stack0x00000008);
  listReader_1.builder.structDataSize = 0xb5ac71c7;
  listReader_1.builder.structPointerCount = 0x98af;
  listReader_1.builder.elementSize = 0x32;
  listReader_1.builder._39_1_ = 0x9a;
  expected_02._M_len = 1;
  expected_02._M_array = (iterator)&listReader_1.builder.structDataSize;
  reader_23.builder.capTable = local_1320.builder.capTable;
  reader_23.builder.segment = local_1320.builder.segment;
  reader_23.builder.ptr = local_1320.builder.ptr;
  reader_23.builder.elementCount = local_1320.builder.elementCount;
  reader_23.builder.step = local_1320.builder.step;
  reader_23.builder.structDataSize = local_1320.builder.structDataSize;
  reader_23.builder.structPointerCount = local_1320.builder.structPointerCount;
  reader_23.builder.elementSize = local_1320.builder.elementSize;
  reader_23.builder._39_1_ = local_1320.builder._39_1_;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_23,expected_02);
  capnproto_test::capnp::test::TestDefaults::Builder::getFloat32List
            ((Builder *)&_kjCondition_37.result,(Builder *)&stack0x00000008);
  local_1388 = 4;
  local_1384 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1388);
  f_1.exception._4_4_ =
       List<float,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_37.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1380,&local_1384,
             (uint *)((long)&f_1.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1380);
  if (!bVar1) {
    _kjCondition_38._28_4_ = 4;
    _kjCondition_38._24_4_ =
         List<float,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_37.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_1398,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x126,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_1380,
               (uint *)&_kjCondition_38.field_0x1c,(uint *)&_kjCondition_38.result);
    kj::_::Debug::Fault::fatal(&local_1398);
  }
  fStack_13c8 = 5555.5;
  local_13c4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffec38);
  local_13cc = List<float,_(capnp::Kind)0>::Builder::operator[]
                         ((Builder *)&_kjCondition_37.result,0);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_13c0,&local_13c4,&local_13cc);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_13c0);
  if (!bVar1) {
    local_13cd = kj::_::Debug::shouldLog(ERROR);
    while (local_13cd != false) {
      _kjCondition_39._28_4_ = 0x45ad9c00;
      _kjCondition_39._24_4_ =
           List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&_kjCondition_37.result,0);
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x127,ERROR,
                 "\"failed: expected \" \"(5555.5f) == (listReader[0])\", _kjCondition, 5555.5f, listReader[0]"
                 ,(char (*) [46])"failed: expected (5555.5f) == (listReader[0])",
                 (DebugComparison<float,_float> *)local_13c0,(float *)&_kjCondition_39.field_0x1c,
                 (float *)&_kjCondition_39.result);
      local_13cd = false;
    }
  }
  fStack_1400 = kj::inf();
  local_13fc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffec00);
  local_1404 = List<float,_(capnp::Kind)0>::Builder::operator[]
                         ((Builder *)&_kjCondition_37.result,1);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_13f8,&local_13fc,&local_1404);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_13f8);
  if (!bVar1) {
    local_1405 = kj::_::Debug::shouldLog(ERROR);
    while (local_1405 != false) {
      _kjCondition_40._28_4_ = kj::inf();
      _kjCondition_40._24_4_ =
           List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&_kjCondition_37.result,1);
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x128,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
                 ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                 (DebugComparison<float,_float> *)local_13f8,(float *)&_kjCondition_40.field_0x1c,
                 (float *)&_kjCondition_40.result);
      local_1405 = false;
    }
  }
  fStack_1438 = kj::inf();
  fStack_1438 = -fStack_1438;
  local_1434 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffebc8);
  local_143c = List<float,_(capnp::Kind)0>::Builder::operator[]
                         ((Builder *)&_kjCondition_37.result,2);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_float> *)local_1430,&local_1434,&local_143c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1430);
  if (!bVar1) {
    local_143d = kj::_::Debug::shouldLog(ERROR);
    while (local_143d != false) {
      fStack_1444 = kj::inf();
      fStack_1444 = -fStack_1444;
      local_1448 = List<float,_(capnp::Kind)0>::Builder::operator[]
                             ((Builder *)&_kjCondition_37.result,2);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,float>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x129,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
                 ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                 (DebugComparison<float,_float> *)local_1430,&stack0xffffffffffffebbc,&local_1448);
      local_143d = false;
    }
  }
  fVar2 = List<float,_(capnp::Kind)0>::Builder::operator[]((Builder *)&_kjCondition_37.result,3);
  listReader_2.builder.elementSize = isNaN(fVar2);
  listReader_2.builder._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                  (bool *)&listReader_2.builder.elementSize);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&listReader_2.builder.field_0x27);
  if (!bVar1) {
    listReader_2.builder.structPointerCount._1_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)listReader_2.builder.structPointerCount._1_1_ != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x12a,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
                 (char (*) [38])"failed: expected isNaN(listReader[3])",
                 (DebugExpression<bool> *)&listReader_2.builder.field_0x27);
      listReader_2.builder.structPointerCount._1_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getFloat64List
            ((Builder *)&_kjCondition_42.result,(Builder *)&stack0x00000008);
  local_14a0 = 4;
  local_149c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_14a0);
  f_2.exception._4_4_ =
       List<double,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_42.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_1498,&local_149c,
             (uint *)((long)&f_2.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1498);
  if (!bVar1) {
    _kjCondition_43._36_4_ = 4;
    _kjCondition_43._32_4_ =
         List<double,_(capnp::Kind)0>::Builder::size((Builder *)&_kjCondition_42.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              (&local_14b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x12e,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_1498,
               (uint *)&_kjCondition_43.field_0x24,(uint *)&_kjCondition_43.result);
    kj::_::Debug::Fault::fatal(&local_14b0);
  }
  local_14f0 = 7777.75;
  local_14e8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_14f0);
  dStack_14f8 = List<double,_(capnp::Kind)0>::Builder::operator[]
                          ((Builder *)&_kjCondition_42.result,0);
  kj::_::DebugExpression<double>::operator==
            ((DebugComparison<double,_double> *)local_14e0,&local_14e8,&stack0xffffffffffffeb08);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_14e0);
  if (!bVar1) {
    local_14f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_14f9 != false) {
      local_1508 = 7777.75;
      _kjCondition_44._32_8_ =
           List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&_kjCondition_42.result,0);
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<double,double>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x12f,ERROR,
                 "\"failed: expected \" \"(7777.75) == (listReader[0])\", _kjCondition, 7777.75, listReader[0]"
                 ,(char (*) [46])"failed: expected (7777.75) == (listReader[0])",
                 (DebugComparison<double,_double> *)local_14e0,&local_1508,
                 (double *)&_kjCondition_44.result);
      local_14f9 = false;
    }
  }
  local_1540 = kj::inf();
  local_153c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1540);
  dStack_1548 = List<double,_(capnp::Kind)0>::Builder::operator[]
                          ((Builder *)&_kjCondition_42.result,1);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_double> *)local_1538,&local_153c,&stack0xffffffffffffeab8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1538);
  if (!bVar1) {
    local_1549 = kj::_::Debug::shouldLog(ERROR);
    while (local_1549 != false) {
      local_1550 = kj::inf();
      _kjCondition_45._32_8_ =
           List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&_kjCondition_42.result,1);
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,double>&,float,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x130,ERROR,
                 "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
                 ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                 (DebugComparison<float,_double> *)local_1538,&local_1550,
                 (double *)&_kjCondition_45.result);
      local_1549 = false;
    }
  }
  local_1588 = kj::inf();
  local_1588 = -local_1588;
  local_1584 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1588);
  dStack_1590 = List<double,_(capnp::Kind)0>::Builder::operator[]
                          ((Builder *)&_kjCondition_42.result,2);
  kj::_::DebugExpression<float>::operator==
            ((DebugComparison<float,_double> *)local_1580,&local_1584,&stack0xffffffffffffea70);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1580);
  if (!bVar1) {
    local_1591 = kj::_::Debug::shouldLog(ERROR);
    while (local_1591 != false) {
      local_1598 = kj::inf();
      local_1598 = -local_1598;
      dStack_15a0 = List<double,_(capnp::Kind)0>::Builder::operator[]
                              ((Builder *)&_kjCondition_42.result,2);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,double>&,float,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x131,ERROR,
                 "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
                 ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                 (DebugComparison<float,_double> *)local_1580,&local_1598,&stack0xffffffffffffea60);
      local_1591 = false;
    }
  }
  dVar3 = List<double,_(capnp::Kind)0>::Builder::operator[]((Builder *)&_kjCondition_42.result,3);
  local_15a2 = isNaN(dVar3);
  local_15a1 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_15a2);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_15a1);
  if (!bVar1) {
    local_15a3 = kj::_::Debug::shouldLog(ERROR);
    while (local_15a3 != false) {
      kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x132,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
                 (char (*) [38])"failed: expected isNaN(listReader[3])",&local_15a1);
      local_15a3 = false;
    }
  }
  capnproto_test::capnp::test::TestDefaults::Builder::getTextList
            (&local_15d0,(Builder *)&stack0x00000008);
  Text::Reader::Reader(&local_1610,"plugh");
  Text::Reader::Reader(&RStack_1600,"xyzzy");
  Text::Reader::Reader(&RStack_15f0,"thud");
  local_15e0 = &local_1610;
  local_15d8 = 3;
  expected_01._M_len = 3;
  expected_01._M_array = local_15e0;
  reader_24.builder.capTable = local_15d0.builder.capTable;
  reader_24.builder.segment = local_15d0.builder.segment;
  reader_24.builder.ptr = local_15d0.builder.ptr;
  reader_24.builder.elementCount = local_15d0.builder.elementCount;
  reader_24.builder.step = local_15d0.builder.step;
  reader_24.builder.structDataSize = local_15d0.builder.structDataSize;
  reader_24.builder.structPointerCount = local_15d0.builder.structPointerCount;
  reader_24.builder.elementSize = local_15d0.builder.elementSize;
  reader_24.builder._39_1_ = local_15d0.builder._39_1_;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_24,expected_01);
  capnproto_test::capnp::test::TestDefaults::Builder::getDataList
            (&local_1638,(Builder *)&stack0x00000008);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("oops");
  _::data("exhausted");
  _::data("rfc3092");
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&listReader_3.builder.structDataSize;
  reader_25.builder.capTable = local_1638.builder.capTable;
  reader_25.builder.segment = local_1638.builder.segment;
  reader_25.builder.ptr = local_1638.builder.ptr;
  reader_25.builder.elementCount = local_1638.builder.elementCount;
  reader_25.builder.step = local_1638.builder.step;
  reader_25.builder.structDataSize = local_1638.builder.structDataSize;
  reader_25.builder.structPointerCount = local_1638.builder.structPointerCount;
  reader_25.builder.elementSize = local_1638.builder.elementSize;
  reader_25.builder._39_1_ = local_1638.builder._39_1_;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
            (reader_25,expected_00);
  capnproto_test::capnp::test::TestDefaults::Builder::getStructList
            ((Builder *)&_kjCondition_47.result,(Builder *)&stack0x00000008);
  local_16c8 = 3;
  local_16c4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_16c8);
  f_3.exception._4_4_ =
       List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                 ((Builder *)&_kjCondition_47.result);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_16c0,&local_16c4,
             (uint *)((long)&f_3.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_16c0);
  if (bVar1) {
    local_1720 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x453130);
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_1760,(Builder *)&_kjCondition_47.result,0);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
              (&local_1738,(Builder *)local_1760);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_1718,
               (DebugExpression<char_const(&)[13]> *)&local_1720,&local_1738);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1718);
    if (!bVar1) {
      local_1761 = kj::_::Debug::shouldLog(ERROR);
      while (local_1761 != false) {
        List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                  ((Builder *)&_kjCondition_49.result,(Builder *)&_kjCondition_47.result,0);
        capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                  (&local_1780,(Builder *)&_kjCondition_49.result);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x139,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"structlist 1\", listReader[0].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 1\") == (listReader[0].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_1718,
                   (char (*) [13])0x453130,&local_1780);
        local_1761 = false;
      }
    }
    local_17e8 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x44222e);
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_1828,(Builder *)&_kjCondition_47.result,1);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
              (&local_1800,(Builder *)local_1828);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_17e0,
               (DebugExpression<char_const(&)[13]> *)&local_17e8,&local_1800);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_17e0);
    if (!bVar1) {
      local_1829 = kj::_::Debug::shouldLog(ERROR);
      while (local_1829 != false) {
        List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                  ((Builder *)&_kjCondition_50.result,(Builder *)&_kjCondition_47.result,1);
        capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
                  (&local_1848,(Builder *)&_kjCondition_50.result);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x13a,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"structlist 2\", listReader[1].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 2\") == (listReader[1].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_17e0,
                   (char (*) [13])0x44222e,&local_1848);
        local_1829 = false;
      }
    }
    local_18b0 = (char (*) [13])
                 kj::_::DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [13])0x4532f0);
    List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_18f0,(Builder *)&_kjCondition_47.result,2);
    capnproto_test::capnp::test::TestAllTypes::Builder::getTextField
              (&local_18c8,(Builder *)local_18f0);
    kj::_::DebugExpression<char_const(&)[13]>::operator==
              ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_18a8,
               (DebugExpression<char_const(&)[13]> *)&local_18b0,&local_18c8);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_18a8);
    if (!bVar1) {
      local_18f1 = kj::_::Debug::shouldLog(ERROR);
      while (local_18f1 != false) {
        List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
                  (&local_1938,(Builder *)&_kjCondition_47.result,2);
        capnproto_test::capnp::test::TestAllTypes::Builder::getTextField(&local_1910,&local_1938);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x13b,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"structlist 3\", listReader[2].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 3\") == (listReader[2].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_18a8,
                   (char (*) [13])0x4532f0,&local_1910);
        local_18f1 = false;
      }
    }
    capnproto_test::capnp::test::TestDefaults::Builder::getEnumList
              (&local_1960,(Builder *)&stack0x00000008);
    local_1974[0] = FOO;
    local_1974[1] = 7;
    local_1970 = local_1974;
    local_1968 = 2;
    expected._M_len = 2;
    expected._M_array = local_1970;
    reader_26.builder.capTable = local_1960.builder.capTable;
    reader_26.builder.segment = local_1960.builder.segment;
    reader_26.builder.ptr = local_1960.builder.ptr;
    reader_26.builder.elementCount = local_1960.builder.elementCount;
    reader_26.builder.step = local_1960.builder.step;
    reader_26.builder.structDataSize = local_1960.builder.structDataSize;
    reader_26.builder.structPointerCount = local_1960.builder.structPointerCount;
    reader_26.builder.elementSize = local_1960.builder.elementSize;
    reader_26.builder._39_1_ = local_1960.builder._39_1_;
    checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Builder,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_false>
              (reader_26,expected);
    return;
  }
  _kjCondition_48._52_4_ = 3;
  _kjCondition_48._48_4_ =
       List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::size
                 ((Builder *)&_kjCondition_47.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            (&local_16d8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x138,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_16c0,
             (uint *)&_kjCondition_48.field_0x34,(uint *)&_kjCondition_48.result);
  kj::_::Debug::Fault::fatal(&local_16d8);
}

Assistant:

void genericCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(true, reader.getBoolField());
  EXPECT_EQ(-123, reader.getInt8Field());
  EXPECT_EQ(-12345, reader.getInt16Field());
  EXPECT_EQ(-12345678, reader.getInt32Field());
  EXPECT_EQ(-123456789012345ll, reader.getInt64Field());
  EXPECT_EQ(234u, reader.getUInt8Field());
  EXPECT_EQ(45678u, reader.getUInt16Field());
  EXPECT_EQ(3456789012u, reader.getUInt32Field());
  EXPECT_EQ(12345678901234567890ull, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(1234.5f, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(-123e45, reader.getFloat64Field());
  EXPECT_EQ("foo", reader.getTextField());
  EXPECT_EQ(data("bar"), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(true, subReader.getBoolField());
    EXPECT_EQ(-12, subReader.getInt8Field());
    EXPECT_EQ(3456, subReader.getInt16Field());
    EXPECT_EQ(-78901234, subReader.getInt32Field());
    EXPECT_EQ(56789012345678ll, subReader.getInt64Field());
    EXPECT_EQ(90u, subReader.getUInt8Field());
    EXPECT_EQ(1234u, subReader.getUInt16Field());
    EXPECT_EQ(56789012u, subReader.getUInt32Field());
    EXPECT_EQ(345678901234567890ull, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(345, subReader.getFloat64Field());
    EXPECT_EQ("baz", subReader.getTextField());
    EXPECT_EQ(data("qux"), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("nested", subSubReader.getTextField());
      EXPECT_EQ("really nested", subSubReader.getStructField().getTextField());
    }
    EXPECT_EQ(TestEnum::BAZ, subReader.getEnumField());

    checkList(subReader.getVoidList(), {VOID, VOID, VOID});
    checkList(subReader.getBoolList(), {false, true, false, true, true});
    checkList(subReader.getInt8List(), {12, -34, -0x80, 0x7f});
    checkList(subReader.getInt16List(), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList(subReader.getInt32List(), {12345678, -90123456, -0x7fffffff - 1, 0x7fffffff});
    checkList(subReader.getInt64List(), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList(subReader.getUInt8List(), {12u, 34u, 0u, 0xffu});
    checkList(subReader.getUInt16List(), {1234u, 5678u, 0u, 0xffffu});
    checkList(subReader.getUInt32List(), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList(subReader.getUInt64List(), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList(subReader.getFloat32List(), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList(subReader.getFloat64List(), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList(subReader.getTextList(), {"quux", "corge", "grault"});
    checkList(subReader.getDataList(), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.getStructList();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].getTextField());
      EXPECT_EQ("x structlist 2", listReader[1].getTextField());
      EXPECT_EQ("x structlist 3", listReader[2].getTextField());
    }
    checkList(subReader.getEnumList(), {TestEnum::QUX, TestEnum::BAR, TestEnum::GRAULT});
  }
  EXPECT_EQ(TestEnum::CORGE, reader.getEnumField());

  EXPECT_EQ(6u, reader.getVoidList().size());
  checkList(reader.getBoolList(), {true, false, false, true});
  checkList(reader.getInt8List(), {111, -111});
  checkList(reader.getInt16List(), {11111, -11111});
  checkList(reader.getInt32List(), {111111111, -111111111});
  checkList(reader.getInt64List(), {1111111111111111111ll, -1111111111111111111ll});
  checkList(reader.getUInt8List(), {111u, 222u});
  checkList(reader.getUInt16List(), {33333u, 44444u});
  checkList(reader.getUInt32List(), {3333333333u});
  checkList(reader.getUInt64List(), {11111111111111111111ull});
  {
    auto listReader = reader.getFloat32List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  {
    auto listReader = reader.getFloat64List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  checkList(reader.getTextList(), {"plugh", "xyzzy", "thud"});
  checkList(reader.getDataList(), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.getStructList();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].getTextField());
    EXPECT_EQ("structlist 2", listReader[1].getTextField());
    EXPECT_EQ("structlist 3", listReader[2].getTextField());
  }
  checkList(reader.getEnumList(), {TestEnum::FOO, TestEnum::GARPLY});
}